

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O3

void __thiscall
dtc::anon_unknown_1::binary_operator<8,_std::less<unsigned_long_long>_>::dump_impl
          (binary_operator<8,_std::less<unsigned_long_long>_> *this)

{
  char *__s;
  size_t sVar1;
  
  (*((this->super_binary_operator_base).lhs._M_t.
     super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
     ._M_t.
     super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
     .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl)->
    _vptr_expression[4])();
  __s = this->opName;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x14a330);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar1);
  }
  (*((this->super_binary_operator_base).rhs._M_t.
     super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
     ._M_t.
     super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
     .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl)->
    _vptr_expression[4])();
  return;
}

Assistant:

void dump_impl() override
	{
		lhs->dump();
		std::cerr << opName;
		rhs->dump();
	}